

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XPathMatcher::XPathMatcher
          (XPathMatcher *this,XercesXPath *xpath,MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_38 [8];
  CleanupType_conflict26 cleanup;
  MemoryManager *manager_local;
  XercesXPath *xpath_local;
  XPathMatcher *this_local;
  
  cleanup._16_8_ = manager;
  XMemory::XMemory((XMemory *)this);
  this->_vptr_XPathMatcher = (_func_int **)&PTR__XPathMatcher_00536788;
  this->fLocationPathSize = 0;
  this->fMatched = (uchar *)0x0;
  this->fNoMatchDepth = (XMLSize_t *)0x0;
  this->fCurrentStep = (XMLSize_t *)0x0;
  this->fStepIndexes = (RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *)0x0;
  this->fLocationPaths = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
  this->fIdentityConstraint = (IdentityConstraint *)0x0;
  this->fMemoryManager = (MemoryManager *)cleanup._16_8_;
  JanitorMemFunCall<xercesc_4_0::XPathMatcher>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcher> *)local_38,this,(MFPT)cleanUp);
  init(this,(EVP_PKEY_CTX *)xpath);
  JanitorMemFunCall<xercesc_4_0::XPathMatcher>::release
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcher> *)local_38);
  JanitorMemFunCall<xercesc_4_0::XPathMatcher>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcher> *)local_38);
  return;
}

Assistant:

XPathMatcher::XPathMatcher( XercesXPath* const xpath
                          , MemoryManager* const manager)
    : fLocationPathSize(0)
    , fMatched(0)
    , fNoMatchDepth(0)
    , fCurrentStep(0)
    , fStepIndexes(0)
    , fLocationPaths(0)
    , fIdentityConstraint(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XPathMatcher::cleanUp);

    try {
        init(xpath);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}